

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Runner::makeReporter(Runner *this)

{
  Config *pCVar1;
  pointer pcVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  IStreamingReporter *p;
  ostream *poVar5;
  domain_error *this_00;
  string reporterName;
  ostringstream oss;
  char *local_1e0;
  long local_1d8;
  char local_1d0 [16];
  string local_1c0 [32];
  Config *local_1a0;
  long local_198;
  
  pCVar1 = (this->m_config).m_p;
  pcVar2 = (pCVar1->m_data).reporterName._M_dataplus._M_p;
  local_1a0 = (Config *)&stack0xfffffffffffffe70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar2,pcVar2 + (pCVar1->m_data).reporterName._M_string_length);
  local_1e0 = local_1d0;
  if (local_198 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"console","");
  }
  else {
    pCVar1 = (this->m_config).m_p;
    pcVar2 = (pCVar1->m_data).reporterName._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar2,pcVar2 + (pCVar1->m_data).reporterName._M_string_length);
  }
  if (local_1a0 != (Config *)&stack0xfffffffffffffe70) {
    operator_delete(local_1a0);
  }
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[2])(pIVar4);
  local_1a0 = (this->m_config).m_p;
  if (local_1a0 != (Config *)0x0) {
    (*(local_1a0->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[2])();
  }
  p = (IStreamingReporter *)
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                ((long *)CONCAT44(extraout_var,iVar3),&local_1e0,&local_1a0);
  Ptr<Catch::IStreamingReporter>::operator=(&this->m_reporter,p);
  if (local_1a0 != (Config *)0x0) {
    (*(local_1a0->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  if ((this->m_reporter).m_p != (IStreamingReporter *)0x0) {
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"No reporter registered with name: \'",0x23);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a0,local_1e0,local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void makeReporter() {
            std::string reporterName = m_config->getReporterName().empty()
                ? "console"
                : m_config->getReporterName();

            m_reporter = getRegistryHub().getReporterRegistry().create( reporterName, m_config.get() );
            if( !m_reporter ) {
                std::ostringstream oss;
                oss << "No reporter registered with name: '" << reporterName << "'";
                throw std::domain_error( oss.str() );
            }
        }